

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process_Unix::CreatePipe(Process_Unix *this,int *filedes)

{
  int arguments_1;
  ILogger *this_00;
  char *arguments_2;
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  int local_24;
  int *piStack_20;
  int status;
  int *filedes_local;
  Process_Unix *this_local;
  
  piStack_20 = filedes;
  filedes_local = (int *)this;
  local_24 = pipe(filedes);
  bVar1 = local_24 != -1;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Process_Unix",&local_49)
    ;
    this_00 = gnilk::Logger::GetLogger(&local_48);
    arguments_1 = local_24;
    arguments_2 = strerror(local_24);
    gnilk::Log::Error<char_const*,int,char*>(this_00,"stdout pipe %d, %s",arguments_1,arguments_2);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return bVar1;
}

Assistant:

bool Process_Unix::CreatePipe(int *filedes) {
	int status = pipe(filedes);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("stdout pipe %d, %s", status, strerror(status));
		return false;
	}
	return true;
}